

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psemaphore-posix.c
# Opt level: O1

PSemaphore * p_semaphore_new(pchar *name,pint init_val,PSemaphoreAccessMode mode,PError **error)

{
  uint uVar1;
  pint pVar2;
  PSemaphore *sem;
  size_t sVar3;
  char *__dest;
  pchar *ppVar4;
  sem_t *psVar5;
  uint uVar6;
  
  if ((name == (pchar *)0x0) || (init_val < 0)) {
    p_semaphore_new_cold_5();
  }
  else {
    sem = (PSemaphore *)p_malloc0(0x20);
    if (sem == (PSemaphore *)0x0) {
      p_semaphore_new_cold_4();
    }
    else {
      sVar3 = strlen(name);
      __dest = (char *)p_malloc0(sVar3 + 0xe);
      if (__dest == (char *)0x0) {
        p_semaphore_new_cold_3();
      }
      else {
        strcpy(__dest,name);
        sVar3 = strlen(__dest);
        builtin_strncpy(__dest + sVar3,"_p_sem_object",0xe);
        ppVar4 = p_ipc_get_platform_key(__dest,1);
        sem->platform_key = ppVar4;
        sem->init_val = init_val;
        sem->mode = mode;
        p_free(__dest);
        if (sem->platform_key == (pchar *)0x0) {
          p_semaphore_new_cold_2();
        }
        else {
          uVar1 = sem->init_val;
          do {
            psVar5 = sem_open(sem->platform_key,0xc0,0x1b0,(ulong)uVar1);
            sem->sem_hdl = (psem_hdl *)psVar5;
            if (psVar5 != (sem_t *)0x0) break;
            pVar2 = p_error_get_last_system();
          } while (pVar2 == 4);
          if (sem->sem_hdl == (psem_hdl *)0x0) {
            pVar2 = p_error_get_last_system();
            if (pVar2 == 0x11) {
              uVar6 = 0;
              if (sem->mode == P_SEM_ACCESS_CREATE) {
                sem_unlink(sem->platform_key);
                uVar6 = uVar1;
              }
              do {
                psVar5 = sem_open(sem->platform_key,0,0,(ulong)uVar6);
                sem->sem_hdl = (psem_hdl *)psVar5;
                if (psVar5 != (sem_t *)0x0) break;
                pVar2 = p_error_get_last_system();
              } while (pVar2 == 4);
            }
          }
          else {
            sem->sem_created = 1;
          }
          if (sem->sem_hdl != (psem_hdl *)0x0) {
            return sem;
          }
          p_semaphore_new_cold_1();
        }
        p_semaphore_free(sem);
      }
    }
  }
  return (PSemaphore *)0x0;
}

Assistant:

P_LIB_API PSemaphore *
p_semaphore_new (const pchar		*name,
		 pint			init_val,
		 PSemaphoreAccessMode	mode,
		 PError			**error)
{
	PSemaphore	*ret;
	pchar		*new_name;

	if (P_UNLIKELY (name == NULL || init_val < 0)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IPC_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return NULL;
	}

	if (P_UNLIKELY ((ret = p_malloc0 (sizeof (PSemaphore))) == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IPC_NO_RESOURCES,
				     0,
				     "Failed to allocate memory for semaphore");
		return NULL;
	}

	if (P_UNLIKELY ((new_name = p_malloc0 (strlen (name) + strlen (P_SEM_SUFFIX) + 1)) == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IPC_NO_RESOURCES,
				     0,
				     "Failed to allocate memory for semaphore");
		p_free (ret);
		return NULL;
	}

	strcpy (new_name, name);
	strcat (new_name, P_SEM_SUFFIX);

#if defined (P_OS_IRIX) || defined (P_OS_TRU64)
	/* IRIX and Tru64 prefer filename styled IPC names */
	ret->platform_key = p_ipc_get_platform_key (new_name, FALSE);
#else
	ret->platform_key = p_ipc_get_platform_key (new_name, TRUE);
#endif
	ret->init_val = init_val;
	ret->mode = mode;

	p_free (new_name);

	if (P_UNLIKELY (pp_semaphore_create_handle (ret, error) == FALSE)) {
		p_semaphore_free (ret);
		return NULL;
	}

	return ret;
}